

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  lts_20250127 *plVar1;
  short *psVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  GeneratorInfo *pGVar6;
  long lVar7;
  int version;
  long lVar8;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ostream *poVar10;
  string *psVar11;
  undefined8 key_00;
  char *pcVar12;
  pointer pcVar13;
  char cVar14;
  HeapOrSoo *this_00;
  char *in_R9;
  ulong uVar15;
  string_view sp;
  string_view sp_00;
  string_view plugin_prefix;
  string_view directive;
  string_view name_00;
  string_view name_01;
  string disk_path;
  string path;
  string plugin_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  undefined1 local_148 [32];
  HeapOrSoo local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  undefined1 local_f8 [40];
  string local_d0 [8];
  undefined1 local_c8 [24];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  HeapOrSoo local_90;
  CommandLineInterface *local_78;
  ByAnyChar local_70;
  ByAnyChar local_50;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "You seem to have passed an empty string as one of the arguments to ",0x43);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(this->executable_name_)._M_dataplus._M_p,
                         (this->executable_name_)._M_string_length);
    pcVar12 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
    lVar8 = 0x7b;
LAB_001dde6f:
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    return PARSE_ARGUMENT_FAIL;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0)) {
    pcVar13 = (value->_M_dataplus)._M_p;
    plVar1 = (lts_20250127 *)value->_M_string_length;
    sp._M_str = ":";
    sp._M_len = 1;
    absl::lts_20250127::ByAnyChar::ByAnyChar(&local_50,sp);
    absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
              (local_f8,plVar1,pcVar13,&local_50);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_90.heap,
                 (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)&local_128.heap,
                 (Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_f8);
    if ((undefined1 *)CONCAT71(local_f8._17_7_,local_f8[0x10]) != local_f8 + 0x20) {
      operator_delete((undefined1 *)CONCAT71(local_f8._17_7_,local_f8[0x10]),
                      (ulong)(local_f8._32_8_ + 1));
    }
    local_78 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.delimiters_._M_dataplus._M_p != &local_50.delimiters_.field_2) {
      operator_delete(local_50.delimiters_._M_dataplus._M_p,
                      local_50.delimiters_.field_2._M_allocated_capacity + 1);
    }
    if (local_90.heap.slot_array.p != (MaybeInitializedPtr)local_90.heap.control) {
      local_78 = (CommandLineInterface *)&local_78->proto_path_;
      lVar8 = 0;
      uVar15 = 0;
      do {
        local_128.heap.control = (ctrl_t *)local_118;
        local_128.heap.slot_array.p = (MaybeInitializedPtr)0x0;
        local_118[0]._M_local_buf[0] = '\0';
        local_148._0_8_ = local_148 + 0x10;
        local_148._8_8_ = (slot_type *)0x0;
        local_148[0x10] = false;
        lVar7 = std::__cxx11::string::find((char)local_90.heap.control + (char)lVar8,0x3d);
        if (lVar7 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_128,0,(char *)local_128.heap.slot_array,0x3b55fc);
          std::__cxx11::string::_M_assign((string *)local_148);
        }
        else {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)(local_90.heap.control + lVar8));
          std::__cxx11::string::operator=((string *)&local_128.heap,(string *)local_f8);
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
          }
          std::__cxx11::string::substr((ulong)local_f8,(ulong)(local_90.heap.control + lVar8));
          std::__cxx11::string::operator=((string *)local_148,(string *)local_f8);
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
          }
        }
        uVar3 = local_148._8_8_;
        if ((slot_type *)local_148._8_8_ == (slot_type *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                     ,0x4b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
        }
        else {
          iVar5 = access((char *)local_148._0_8_,0);
          if (iVar5 < 0) {
            iVar5 = access(*(char **)(local_90.heap.control + lVar8),0);
            if (iVar5 < 0) {
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_148._0_8_,local_148._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,": warning: directory does not exist.",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            else {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_128,0,(char *)local_128.heap.slot_array,0x3b55fc);
              std::__cxx11::string::_M_assign((string *)local_148);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_128.heap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148)
          ;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)local_78,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8);
          if ((undefined1 *)local_f8._32_8_ != local_c8) {
            operator_delete((void *)local_f8._32_8_,local_c8._0_8_ + 1);
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
          }
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.heap.control != local_118) {
          operator_delete(local_128.heap.control,
                          CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                   local_118[0]._M_local_buf[0]) + 1);
        }
        if ((slot_type *)uVar3 == (slot_type *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_90.heap);
          return PARSE_ARGUMENT_FAIL;
        }
        uVar15 = uVar15 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar15 < (ulong)((long)local_90.heap.slot_array - local_90._0_8_ >> 5));
    }
    this_00 = &local_90;
LAB_001dddcf:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this_00->heap);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    if (this->direct_dependencies_explicitly_set_ == true) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar12 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
      lVar8 = 0x78;
      goto LAB_001dde6f;
    }
    this->direct_dependencies_explicitly_set_ = true;
    local_f8._8_8_ = (value->_M_dataplus)._M_p;
    local_f8._0_8_ = value->_M_string_length;
    local_f8[0x10] = ':';
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128.heap,
                 (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_148,
                 (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_f8);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              (&(this->direct_dependencies_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    uVar3 = local_128.heap.slot_array;
    if (1 < (this->direct_dependencies_).
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x84c,"direct_dependencies_.empty()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_f8);
    }
    if ((MaybeInitializedPtr)local_128.heap.control != local_128.heap.slot_array.p) {
      key_00 = local_128.heap.control;
      do {
        local_148._0_8_ = &this->direct_dependencies_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                    *)local_f8,local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key_00);
        key_00 = key_00 + 0x20;
      } while (key_00 != uVar3);
    }
    this_00 = &local_128;
    goto LAB_001dddcf;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    psVar11 = (string *)&this->direct_dependencies_violation_msg_;
LAB_001ddeaa:
    std::__cxx11::string::_M_assign(psVar11);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    if ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      plVar1 = (lts_20250127 *)value->_M_string_length;
      if (plVar1 == (lts_20250127 *)0x0) {
LAB_001de72e:
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        pcVar12 = " requires a non-empty value.";
        lVar8 = 0x1c;
      }
      else {
        if ((this->dependency_out_name_)._M_string_length == 0) {
          pcVar13 = (value->_M_dataplus)._M_p;
          sp_00._M_str = ":";
          sp_00._M_len = 1;
          absl::lts_20250127::ByAnyChar::ByAnyChar(&local_70,sp_00);
          absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                    (local_f8,plVar1,pcVar13,&local_70);
          absl::lts_20250127::strings_internal::
          Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::
          ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_128.heap,
                       (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_148,
                       (Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->descriptor_set_in_names_,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_128.heap);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128.heap);
          if ((undefined1 *)CONCAT71(local_f8._17_7_,local_f8[0x10]) != local_f8 + 0x20) {
            operator_delete((undefined1 *)CONCAT71(local_f8._17_7_,local_f8[0x10]),
                            (ulong)(local_f8._32_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.delimiters_._M_dataplus._M_p == &local_70.delimiters_.field_2) {
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
LAB_001de176:
          operator_delete(local_70.delimiters_._M_dataplus._M_p,
                          local_70.delimiters_.field_2._M_allocated_capacity + 1);
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        pcVar12 = " cannot be used with --dependency_out.";
        lVar8 = 0x26;
      }
    }
    else {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      pcVar12 = "\'.";
      lVar8 = 2;
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)name);
    if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0)) {
      if ((this->descriptor_set_out_name_)._M_string_length != 0) goto LAB_001ddf51;
      if (value->_M_string_length == 0) goto LAB_001de72e;
      if (this->mode_ == MODE_COMPILE) {
        psVar11 = (string *)&this->descriptor_set_out_name_;
        goto LAB_001ddeaa;
      }
      poVar10 = (ostream *)&std::cerr;
      pcVar12 = "Cannot use --encode or --decode and generate descriptors at the same time.";
      lVar8 = 0x4a;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)name);
      if (iVar5 == 0) {
        if ((this->dependency_out_name_)._M_string_length == 0) {
          if (value->_M_string_length == 0) goto LAB_001de72e;
          if ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar11 = (string *)&this->dependency_out_name_;
            goto LAB_001ddeaa;
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length
                              );
          pcVar12 = " cannot be used with --descriptor_set_in.";
          lVar8 = 0x29;
          goto LAB_001de753;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)name);
        if (iVar5 == 0) {
          if (this->imports_in_descriptor_set_ != true) {
            this->imports_in_descriptor_set_ = true;
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)name);
          if (iVar5 == 0) {
            if (this->source_info_in_descriptor_set_ != true) {
              this->source_info_in_descriptor_set_ = true;
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)name);
            if (iVar5 != 0) {
              iVar5 = std::__cxx11::string::compare((char *)name);
              if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0))
              {
                PrintHelpText(this);
                return PARSE_ARGUMENT_DONE_AND_EXIT;
              }
              iVar5 = std::__cxx11::string::compare((char *)name);
              if (iVar5 == 0) {
                sVar9 = (this->version_info_)._M_string_length;
                if (sVar9 != 0) {
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(this->version_info_)._M_dataplus._M_p,
                                       sVar9);
                  std::endl<char,std::char_traits<char>>(poVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"libprotoc ",10);
                internal::ProtocVersionString_abi_cxx11_
                          ((string *)local_f8,(internal *)0x5c0698,version);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_f8._0_8_,local_f8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-dev",4);
                std::endl<char,std::char_traits<char>>(poVar10);
                if ((undefined1 *)local_f8._0_8_ == local_f8 + 0x10) {
                  return PARSE_ARGUMENT_DONE_AND_EXIT;
                }
                operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1)
                ;
                return PARSE_ARGUMENT_DONE_AND_EXIT;
              }
              iVar5 = std::__cxx11::string::compare((char *)name);
              if (iVar5 == 0) {
                this->disallow_services_ = true;
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
              iVar5 = std::__cxx11::string::compare((char *)name);
              if (iVar5 == 0) {
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
              iVar5 = std::__cxx11::string::compare((char *)name);
              if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0)
                  ) || (iVar5 = std::__cxx11::string::compare((char *)name), iVar5 == 0)) {
                if (this->mode_ == MODE_COMPILE) {
                  if (((this->output_directives_).
                       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       (this->output_directives_).
                       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                    iVar5 = std::__cxx11::string::compare((char *)name);
                    this->mode_ = MODE_DECODE - (iVar5 == 0);
                    if (value->_M_string_length == 0) {
                      iVar5 = std::__cxx11::string::compare((char *)name);
                      if (iVar5 != 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Type name for ",0xe);
                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                             name->_M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10," cannot be blank.",0x11);
                        std::endl<char,std::char_traits<char>>(poVar10);
                        iVar5 = std::__cxx11::string::compare((char *)name);
                        if (iVar5 == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "To decode an unknown message, use --decode_raw.",0x2f);
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                          return PARSE_ARGUMENT_FAIL;
                        }
                        return PARSE_ARGUMENT_FAIL;
                      }
                      if (value->_M_string_length != 0) goto LAB_001de2d7;
                    }
                    else {
LAB_001de2d7:
                      iVar5 = std::__cxx11::string::compare((char *)name);
                      if (iVar5 == 0) {
                        pcVar12 = "--decode_raw does not take a parameter.";
                        goto LAB_001de44a;
                      }
                    }
                    psVar11 = (string *)&this->codec_type_;
LAB_001de2f8:
                    std::__cxx11::string::_M_assign(psVar11);
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
LAB_001de6b0:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Cannot use ",0xb);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                       name->_M_string_length);
                  pcVar12 = " and generate code or descriptors at the same time.";
                  lVar8 = 0x33;
                }
                else {
                  poVar10 = (ostream *)&std::cerr;
                  pcVar12 = "Only one of --encode and --decode can be specified.";
                  lVar8 = 0x33;
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)name);
                if (iVar5 == 0) {
                  this->deterministic_output_ = true;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
                iVar5 = std::__cxx11::string::compare((char *)name);
                if (iVar5 == 0) {
                  iVar5 = std::__cxx11::string::compare((char *)value);
                  if (iVar5 == 0) {
                    this->error_format_ = ERROR_FORMAT_GCC;
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  iVar5 = std::__cxx11::string::compare((char *)value);
                  if (iVar5 == 0) {
                    this->error_format_ = ERROR_FORMAT_MSVS;
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unknown error format: ",0x16);
                  pcVar13 = (value->_M_dataplus)._M_p;
                  sVar9 = value->_M_string_length;
LAB_001de388:
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,pcVar13,sVar9);
                  goto LAB_001de75b;
                }
                iVar5 = std::__cxx11::string::compare((char *)name);
                if (iVar5 == 0) {
                  if (this->fatal_warnings_ != true) {
                    this->fatal_warnings_ = true;
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  goto LAB_001ddf51;
                }
                iVar5 = std::__cxx11::string::compare((char *)name);
                cVar14 = (char)value;
                if (iVar5 != 0) {
                  iVar5 = std::__cxx11::string::compare((char *)name);
                  if (iVar5 == 0) {
                    if (this->mode_ == MODE_COMPILE) {
                      if (((this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_finish) &&
                         ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                        this->mode_ = MODE_PRINT;
                        this->print_mode_ = PRINT_FREE_FIELDS;
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
                      goto LAB_001de6b0;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Cannot use ",0xb);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                         name->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10," and use --encode, --decode or print ",0x25);
                    pcVar12 = "other info at the same time.";
                    lVar8 = 0x1c;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)name);
                    if (iVar5 == 0) {
                      setenv("PROTOC_CODEGEN_TRACE","yes",0);
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    iVar5 = std::__cxx11::string::compare((char *)name);
                    if (iVar5 == 0) {
                      poVar10 = std::operator<<((ostream *)&std::cout,notices_text);
                      std::endl<char,std::char_traits<char>>(poVar10);
                      return PARSE_ARGUMENT_DONE_AND_EXIT;
                    }
                    iVar5 = std::__cxx11::string::compare((char *)name);
                    if (iVar5 == 0) {
                      this->experimental_editions_ = true;
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    iVar5 = std::__cxx11::string::compare((char *)name);
                    if (iVar5 == 0) {
                      if ((this->edition_defaults_out_name_)._M_string_length != 0)
                      goto LAB_001ddf51;
                      if (value->_M_string_length == 0) goto LAB_001de72e;
                      if (this->mode_ == MODE_COMPILE) {
                        psVar11 = (string *)&this->edition_defaults_out_name_;
                        goto LAB_001de2f8;
                      }
                      poVar10 = (ostream *)&std::cerr;
                      pcVar12 = 
                      "Cannot use --encode or --decode and generate defaults at the same time.";
                      lVar8 = 0x47;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)name);
                      if (iVar5 == 0) {
                        if (this->edition_defaults_minimum_ != EDITION_UNKNOWN) goto LAB_001ddf51;
                        local_f8._0_8_ = (char *)0x8;
                        local_f8._8_8_ = "EDITION_";
                        local_128.heap.slot_array = (MaybeInitializedPtr)(value->_M_dataplus)._M_p;
                        local_128.heap.control = (ctrl_t *)value->_M_string_length;
                        absl::lts_20250127::StrCat_abi_cxx11_
                                  ((string *)local_148,(lts_20250127 *)local_f8,
                                   (AlphaNum *)&local_128.heap,(AlphaNum *)local_128.heap.control);
                        name_00._M_str = (char *)local_148._0_8_;
                        name_00._M_len = local_148._8_8_;
                        bVar4 = Edition_Parse(name_00,&this->edition_defaults_minimum_);
LAB_001de8a2:
                        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                          operator_delete((void *)local_148._0_8_,
                                          CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
                        }
                        if (bVar4 != false) {
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                             name->_M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10," unknown edition \"",0x12);
                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10,(value->_M_dataplus)._M_p,
                                             value->_M_string_length);
                        pcVar12 = "\".";
                        lVar8 = 2;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)name);
                        if (iVar5 == 0) {
                          if (this->edition_defaults_maximum_ == EDITION_UNKNOWN) {
                            local_f8._0_8_ = (char *)0x8;
                            local_f8._8_8_ = "EDITION_";
                            local_128.heap.slot_array =
                                 (MaybeInitializedPtr)(value->_M_dataplus)._M_p;
                            local_128.heap.control = (ctrl_t *)value->_M_string_length;
                            absl::lts_20250127::StrCat_abi_cxx11_
                                      ((string *)local_148,(lts_20250127 *)local_f8,
                                       (AlphaNum *)&local_128.heap,
                                       (AlphaNum *)local_128.heap.control);
                            name_01._M_str = (char *)local_148._0_8_;
                            name_01._M_len = local_148._8_8_;
                            bVar4 = Edition_Parse(name_01,&this->edition_defaults_maximum_);
                            goto LAB_001de8a2;
                          }
                          goto LAB_001ddf51;
                        }
                        pGVar6 = FindGeneratorByFlag(this,name);
                        if ((pGVar6 == (GeneratorInfo *)0x0) &&
                           ((((this->plugin_prefix_)._M_string_length == 0 ||
                             (name->_M_string_length < 4)) ||
                            (*(int *)((name->_M_dataplus)._M_p + (name->_M_string_length - 4)) !=
                             0x74756f5f)))) {
                          pGVar6 = FindGeneratorByOption(this,name);
                          if (pGVar6 != (GeneratorInfo *)0x0) {
                            absl::lts_20250127::container_internal::
                            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            ::try_emplace_impl<std::__cxx11::string_const&>
                                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                        *)local_f8,&this->generator_parameters_,&pGVar6->flag_name);
                            lVar8 = *(long *)(local_f8._8_8_ + 0x28);
                            local_128.heap.slot_array = (MaybeInitializedPtr)local_f8._8_8_;
joined_r0x001deb7d:
                            if (lVar8 != 0) {
                              std::__cxx11::string::append
                                        (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)((long)local_128.heap.slot_array + 0x20))->_M_local_buf
                                        );
                            }
                            std::__cxx11::string::_M_append
                                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)((long)local_128.heap.slot_array + 0x20))->_M_local_buf,
                                       (ulong)(value->_M_dataplus)._M_p);
                            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                          }
                          pcVar12 = (char *)name->_M_string_length;
                          if ((((char *)0x1 < pcVar12) &&
                              (psVar2 = (short *)(name->_M_dataplus)._M_p,
                              (char *)0x3 < pcVar12 && *psVar2 == 0x2d2d)) &&
                             (*(int *)((long)(psVar2 + -2) + (long)pcVar12) == 0x74706f5f)) {
                            plugin_prefix._M_str = pcVar12;
                            plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
                            directive._M_str = in_R9;
                            directive._M_len = (size_t)psVar2;
                            compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                                      ((string *)local_f8,
                                       (_anonymous_namespace_ *)
                                       (this->plugin_prefix_)._M_string_length,plugin_prefix,
                                       directive);
                            absl::lts_20250127::container_internal::
                            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            ::try_emplace_impl<std::__cxx11::string>
                                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                        *)&local_128.heap,&this->plugin_parameters_,
                                       (string *)local_f8);
                            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                              operator_delete((void *)local_f8._0_8_,
                                              CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
                            }
                            lVar8 = *(long *)((long)local_128.heap.slot_array + 0x28);
                            goto joined_r0x001deb7d;
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"Unknown flag: ",0xe);
                          pcVar13 = (name->_M_dataplus)._M_p;
                          sVar9 = name->_M_string_length;
                          goto LAB_001de388;
                        }
                        if (this->mode_ == MODE_COMPILE) {
                          local_f8._0_8_ = local_f8 + 0x10;
                          local_f8._8_8_ = (slot_type *)0x0;
                          local_f8[0x10] = '\0';
                          local_d0 = (string  [8])(local_c8 + 8);
                          local_c8._0_8_ = 0;
                          local_c8[8] = '\0';
                          local_b0._M_p = (pointer)&local_a0;
                          local_a8 = 0;
                          local_a0._M_local_buf[0] = '\0';
                          std::__cxx11::string::_M_assign((string *)local_f8);
                          if (pGVar6 == (GeneratorInfo *)0x0) {
                            local_f8._32_8_ = (CodeGenerator *)0x0;
                          }
                          else {
                            local_f8._32_8_ = pGVar6->generator;
                          }
                          lVar8 = std::__cxx11::string::find(cVar14,0x3a);
                          if (lVar8 == -1) {
                            std::__cxx11::string::_M_assign((string *)&local_b0);
                          }
                          else {
                            std::__cxx11::string::substr((ulong)&local_128,(ulong)value);
                            std::__cxx11::string::operator=(local_d0,(string *)&local_128.heap);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_128.heap.control != local_118) {
                              operator_delete(local_128.heap.control,
                                              CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                                       local_118[0]._M_local_buf[0]) + 1);
                            }
                            std::__cxx11::string::substr((ulong)&local_128,(ulong)value);
                            std::__cxx11::string::operator=
                                      ((string *)&local_b0,(string *)&local_128.heap);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_128.heap.control != local_118) {
                              operator_delete(local_128.heap.control,
                                              CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                                       local_118[0]._M_local_buf[0]) + 1);
                            }
                          }
                          std::
                          vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                          ::push_back(&this->output_directives_,(value_type *)local_f8);
                          OutputDirective::~OutputDirective((OutputDirective *)local_f8);
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        poVar10 = (ostream *)&std::cerr;
                        pcVar12 = 
                        "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                        ;
                        lVar8 = 0x56;
                      }
                    }
                  }
                  goto LAB_001de753;
                }
                if ((this->plugin_prefix_)._M_string_length != 0) {
                  local_f8._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_f8[0x10] = '\0';
                  local_128.heap.slot_array.p = (MaybeInitializedPtr)0x0;
                  local_118[0]._M_local_buf[0] = '\0';
                  local_128.heap.control = (ctrl_t *)local_118;
                  local_f8._0_8_ = local_f8 + 0x10;
                  lVar8 = std::__cxx11::string::find(cVar14,0x3d);
                  if (lVar8 == -1) {
                    lVar8 = std::__cxx11::string::rfind(cVar14,0x2f);
                    if (lVar8 == -1) {
                      std::__cxx11::string::_M_assign((string *)local_f8);
                    }
                    else {
                      std::__cxx11::string::substr((ulong)local_148,(ulong)value);
                      std::__cxx11::string::operator=((string *)local_f8,(string *)local_148);
                      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                        operator_delete((void *)local_148._0_8_,
                                        CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
                      }
                    }
                    std::__cxx11::string::_M_assign((string *)&local_128.heap);
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_148,(ulong)value);
                    std::__cxx11::string::operator=((string *)local_f8,(string *)local_148);
                    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                      operator_delete((void *)local_148._0_8_,
                                      CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
                    }
                    std::__cxx11::string::substr((ulong)local_148,(ulong)value);
                    std::__cxx11::string::operator=((string *)&local_128.heap,(string *)local_148);
                    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                      operator_delete((void *)local_148._0_8_,
                                      CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
                    }
                  }
                  absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::try_emplace_impl<std::__cxx11::string_const&>
                            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                              *)local_148,&this->plugins_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8);
                  std::__cxx11::string::_M_assign((string *)(local_148._8_8_ + 0x20));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128.heap.control != local_118) {
                    operator_delete(local_128.heap.control,
                                    CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                             local_118[0]._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_f8._0_8_ == local_f8 + 0x10) {
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  local_70.delimiters_.field_2._M_allocated_capacity =
                       CONCAT71(local_f8._17_7_,local_f8[0x10]);
                  local_70.delimiters_._M_dataplus._M_p = (pointer)local_f8._0_8_;
                  goto LAB_001de176;
                }
                pcVar12 = "This compiler does not support plugins.";
LAB_001de44a:
                poVar10 = (ostream *)&std::cerr;
                lVar8 = 0x27;
              }
              goto LAB_001de753;
            }
            if (this->retain_options_in_descriptor_set_ != true) {
              this->retain_options_in_descriptor_set_ = true;
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
          }
        }
      }
LAB_001ddf51:
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar12 = " may only be passed once.";
      lVar8 = 0x19;
    }
  }
LAB_001de753:
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar8);
LAB_001de75b:
  std::endl<char,std::char_traits<char>>(poVar10);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value, [this](const std::string& path) {
          this->input_files_.push_back(path);
        })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

    for (size_t i = 0; i < parts.size(); ++i) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        absl::StrSplit(value, ':', absl::SkipEmpty());
    ABSL_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "--retain_options") {
    if (retain_options_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    retain_options_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc "
              << ::google::protobuf::internal::ProtocVersionString(
                     PROTOBUF_VERSION)
              << PROTOBUF_VERSION_SUFFIX << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;
  } else if (name == "--experimental_allow_proto3_optional") {
    // Flag is no longer observed, but we allow it for backward compat.
  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--deterministic_output") {
    deterministic_output_ = true;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--fatal_warnings") {
    if (fatal_warnings_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    fatal_warnings_ = true;
  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--enable_codegen_trace") {
    // We use environment variables here so that subprocesses see this setting
    // when we spawn them.
    //
    // Setting environment variables is more-or-less asking for a data race,
    // because C got this wrong and did not mandate synchronization.
    // In practice, this code path is "only" in the main thread of protoc, and
    // it is common knowledge that touching setenv in a library is asking for
    // life-ruining bugs *anyways*. As such, there is a reasonable probability
    // that there isn't another thread kicking environment variables at this
    // moment.

#ifdef _WIN32
    ::_putenv(absl::StrCat(io::Printer::kProtocCodegenTrace, "=yes").c_str());
#else
    ::setenv(io::Printer::kProtocCodegenTrace.data(), "yes", 0);
#endif
  } else if (name == "--notices") {
    std::cout << notices_text << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  } else if (name == "--experimental_editions") {
    // If you're reading this, you're probably wondering what
    // --experimental_editions is for and thinking of turning it on. This is an
    // experimental, undocumented, unsupported flag. Enable it at your own risk
    // (or, just don't!).
    experimental_editions_ = true;
  } else if (name == "--edition_defaults_out") {
    if (!edition_defaults_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate defaults at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    edition_defaults_out_name_ = value;
  } else if (name == "--edition_defaults_minimum") {
    if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_minimum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else if (name == "--edition_defaults_maximum") {
    if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_maximum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info = FindGeneratorByFlag(name);
    if (generator_info == nullptr &&
        (plugin_prefix_.empty() || !absl::EndsWith(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindGeneratorByOption(name);
      if (generator_info != nullptr) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (absl::StartsWith(name, "--") && absl::EndsWith(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == nullptr) {
        directive.generator = nullptr;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}